

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::CharBitvec::ToEquivClass<char16_t>
          (CharBitvec *this,ArenaAllocator *allocator,uint base,uint *tblidx,
          CharSet<char16_t> *result,codepoint_t baseOffset)

{
  uint uVar1;
  Char lc;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  uint h;
  int iVar7;
  int i;
  uint l;
  long lVar8;
  char16 local_78 [4];
  char16_t equivl [4];
  uint local_34 [2];
  uint acth;
  
  equivl = (char16_t  [4])result;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  iVar5 = -1;
  do {
    iVar4 = NextSet(this,iVar5 + 1);
    if (-1 < iVar4) {
      iVar5 = NextClear(this,iVar4 + 1);
      if (iVar5 < 0) {
        iVar5 = 0xff;
      }
      else {
        if (iVar5 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                             ,0xa9,"(hi > 0)","hi > 0");
          if (!bVar3) {
LAB_00e73533:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
        iVar5 = iVar5 + -1;
      }
      l = iVar4 + base + baseOffset;
      h = base + baseOffset + iVar5;
      do {
        CaseInsensitive::RangeToEquivClass(tblidx,l,h,local_34,local_78);
        iVar7 = local_34[0] - l;
        lVar8 = 0;
        do {
          lc = local_78[lVar8];
          uVar1 = (uint)(ushort)lc + iVar7;
          if (0xffff < uVar1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                               ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
            if (!bVar3) goto LAB_00e73533;
            *puVar6 = 0;
          }
          CharSet<char16_t>::SetRange((CharSet<char16_t> *)equivl,allocator,lc,(Char)uVar1);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        l = local_34[0] + 1;
      } while (l <= h);
    }
    if (iVar4 < 0) {
      return;
    }
  } while( true );
}

Assistant:

void CharBitvec::ToEquivClass(ArenaAllocator* allocator, uint base, uint& tblidx, CharSet<C>& result, codepoint_t baseOffset) const
    {
        int hi = -1;
        while (true)
        {
            // Find the next range of set bits in vector
            int li = NextSet(hi + 1);
            if (li < 0)
                return;
            hi = NextClear(li + 1);
            if (hi < 0)
                hi = Size - 1;
            else
            {
                Assert(hi > 0);
                hi--;
            }

            // Convert to character codes
            uint l = base + li + baseOffset;
            uint h = base + hi + baseOffset;

            do
            {
                uint acth;
                C equivl[CaseInsensitive::EquivClassSize];
                CaseInsensitive::RangeToEquivClass(tblidx, l, h, acth, equivl);
                uint n = acth - l;
                for (int i = 0; i < CaseInsensitive::EquivClassSize; i++)
                {
                    result.SetRange(allocator, equivl[i], Chars<C>::Shift(equivl[i], n));
                }

                // Go around again for rest of this range
                l = acth + 1;
            }
            while (l <= h);
        }
    }